

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

void __thiscall btSoftBody::releaseCluster(btSoftBody *this,int index)

{
  Cluster **ppCVar1;
  int in_ESI;
  Cluster *in_RDI;
  Cluster *c;
  Cluster *local_18 [3];
  
  ppCVar1 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                      ((btAlignedObjectArray<btSoftBody::Cluster_*> *)
                       (in_RDI[3].m_invwi.m_el[0].m_floats + 2),in_ESI);
  local_18[0] = *ppCVar1;
  if (local_18[0]->m_leaf != (btDbvtNode *)0x0) {
    btDbvt::remove((btDbvt *)(in_RDI[3].m_framexform.m_basis.m_el + 2),(char *)local_18[0]->m_leaf);
  }
  Cluster::~Cluster(in_RDI);
  btAlignedFreeInternal((void *)0x26f8bf);
  btAlignedObjectArray<btSoftBody::Cluster_*>::remove
            ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI[3].m_invwi.m_el[0].m_floats + 2)
             ,(char *)local_18);
  return;
}

Assistant:

void			btSoftBody::releaseCluster(int index)
{
	Cluster*	c=m_clusters[index];
	if(c->m_leaf) m_cdbvt.remove(c->m_leaf);
	c->~Cluster();
	btAlignedFree(c);
	m_clusters.remove(c);
}